

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

byte * Js::ByteCodeBufferReader::ReadInt32(byte *buffer,size_t remainingBytes,int *value)

{
  byte *pbVar1;
  int *value_local;
  size_t remainingBytes_local;
  byte *buffer_local;
  
  pbVar1 = ReadVariableInt<int>(buffer,remainingBytes,value);
  return pbVar1;
}

Assistant:

static const byte * ReadInt32(const byte * buffer, size_t remainingBytes, int * value)
    {
#if VARIABLE_INT_ENCODING
        return ReadVariableInt<int>(buffer, remainingBytes, value);
#else
        Assert(remainingBytes >= sizeof(int));
        return ReadConstantSizedInt32(buffer, remainingBytes, value);
#endif
    }